

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.h
# Opt level: O1

void __thiscall
CNetAddr::UnserializeV2Stream<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>>
          (CNetAddr *this,ParamsStream<HashVerifier<AutoFile>_&,_CAddress::SerParams> *s)

{
  uchar *puVar1;
  uchar *puVar2;
  uint uVar3;
  HashVerifier<AutoFile> *pHVar4;
  uint8_t possible_bip155_net;
  bool bVar5;
  string *psVar6;
  uint uVar7;
  size_t in_RCX;
  CNetAddr *pCVar8;
  long lVar9;
  undefined1 in_R8B;
  undefined7 in_register_00000081;
  long in_FS_OFFSET;
  size_t address_size;
  uint8_t obj;
  size_t local_58;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pHVar4 = s->m_substream;
  AutoFile::read(pHVar4->m_source,(int)&local_50,(void *)0x1,in_RCX);
  CSHA256::Write((CSHA256 *)pHVar4,(uchar *)&local_50,1);
  possible_bip155_net = (uint8_t)local_50._M_dataplus._M_p;
  local_58 = ReadCompactSize<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>>(s,true);
  if (local_58 < 0x201) {
    this->m_scope_id = 0;
    bVar5 = SetNetFromBIP155Network(this,possible_bip155_net,local_58);
    if (bVar5) {
      prevector<16U,_unsigned_char,_unsigned_int,_int>::resize(&this->m_addr,(size_type)local_58);
      uVar3 = (this->m_addr)._size;
      uVar7 = uVar3 - 0x11;
      pCVar8 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
      if (uVar3 < 0x11) {
        uVar7 = uVar3;
        pCVar8 = this;
      }
      pHVar4 = s->m_substream;
      AutoFile::read(pHVar4->m_source,(int)pCVar8,(void *)(ulong)uVar7,in_RCX);
      CSHA256::Write((CSHA256 *)pHVar4,(uchar *)pCVar8,(size_t)(ulong)uVar7);
      if (this->m_net == NET_IPV6) {
        uVar3 = (this->m_addr)._size;
        uVar7 = uVar3 - 0x11;
        if (uVar3 < 0x11) {
          uVar7 = uVar3;
        }
        if (5 < uVar7) {
          pCVar8 = this;
          if (0x10 < uVar3) {
            pCVar8 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
          }
          if ((pCVar8->m_addr)._union.direct[0] == -3) {
            lVar9 = 1;
            do {
              if (lVar9 == 6) {
                this->m_net = NET_INTERNAL;
                pCVar8 = this;
                if (0x10 < uVar3) {
                  pCVar8 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
                }
                (pCVar8->m_addr)._union.indirect_contents.indirect =
                     *(char **)((long)&(pCVar8->m_addr)._union.indirect_contents.indirect + 6);
                *(undefined2 *)((long)&(pCVar8->m_addr)._union + 8) =
                     *(undefined2 *)((long)&(pCVar8->m_addr)._union + 0xe);
                prevector<16U,_unsigned_char,_unsigned_int,_int>::resize(&this->m_addr,10);
                goto LAB_0086a67b;
              }
              puVar1 = INTERNAL_IN_IPV6_PREFIX._M_elems + lVar9;
              puVar2 = (uchar *)((pCVar8->m_addr)._union.direct + lVar9);
              lVar9 = lVar9 + 1;
            } while (*puVar1 == *puVar2);
          }
        }
        if (0xb < uVar7) {
          pCVar8 = this;
          if (0x10 < uVar3) {
            pCVar8 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
          }
          if ((pCVar8->m_addr)._union.direct[0] == '\0') {
            lVar9 = 1;
            do {
              if (lVar9 == 0xc) goto LAB_0086a65f;
              puVar1 = IPV4_IN_IPV6_PREFIX._M_elems + lVar9;
              puVar2 = (uchar *)((pCVar8->m_addr)._union.direct + lVar9);
              lVar9 = lVar9 + 1;
            } while (*puVar1 == *puVar2);
          }
        }
        if (5 < uVar7) {
          pCVar8 = this;
          if (0x10 < uVar3) {
            pCVar8 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
          }
          if ((pCVar8->m_addr)._union.direct[0] == -3) {
            lVar9 = 1;
            do {
              if (lVar9 == 6) goto LAB_0086a65f;
              puVar1 = TORV2_IN_IPV6_PREFIX._M_elems + lVar9;
              puVar2 = (uchar *)((pCVar8->m_addr)._union.direct + lVar9);
              lVar9 = lVar9 + 1;
            } while (*puVar1 == *puVar2);
          }
        }
      }
    }
    else {
      HashVerifier<AutoFile>::ignore(s->m_substream,local_58);
LAB_0086a65f:
      this->m_net = NET_IPV6;
      local_50._M_dataplus._M_p._0_1_ = '\0';
      prevector<16U,_unsigned_char,_unsigned_int,_int>::assign
                (&this->m_addr,0x10,(uchar *)&local_50);
    }
LAB_0086a67b:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  else {
    psVar6 = (string *)__cxa_allocate_exception(0x20);
    tinyformat::format<unsigned_long,unsigned_long>
              (&local_50,(tinyformat *)"Address too long: %u > %u",(char *)&local_58,
               &MAX_ADDRV2_SIZE,(unsigned_long *)CONCAT71(in_register_00000081,in_R8B));
    std::ios_base::failure[abi:cxx11]::failure(psVar6);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      __cxa_throw(psVar6,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

void UnserializeV2Stream(Stream& s)
    {
        uint8_t bip155_net;
        s >> bip155_net;

        size_t address_size;
        s >> COMPACTSIZE(address_size);

        if (address_size > MAX_ADDRV2_SIZE) {
            throw std::ios_base::failure(strprintf(
                "Address too long: %u > %u", address_size, MAX_ADDRV2_SIZE));
        }

        m_scope_id = 0;

        if (SetNetFromBIP155Network(bip155_net, address_size)) {
            m_addr.resize(address_size);
            s >> Span{m_addr};

            if (m_net != NET_IPV6) {
                return;
            }

            // Do some special checks on IPv6 addresses.

            // Recognize NET_INTERNAL embedded in IPv6, such addresses are not
            // gossiped but could be coming from addrman, when unserializing from
            // disk.
            if (util::HasPrefix(m_addr, INTERNAL_IN_IPV6_PREFIX)) {
                m_net = NET_INTERNAL;
                memmove(m_addr.data(), m_addr.data() + INTERNAL_IN_IPV6_PREFIX.size(),
                        ADDR_INTERNAL_SIZE);
                m_addr.resize(ADDR_INTERNAL_SIZE);
                return;
            }

            if (!util::HasPrefix(m_addr, IPV4_IN_IPV6_PREFIX) &&
                !util::HasPrefix(m_addr, TORV2_IN_IPV6_PREFIX)) {
                return;
            }

            // IPv4 and TORv2 are not supposed to be embedded in IPv6 (like in V1
            // encoding). Unserialize as !IsValid(), thus ignoring them.
        } else {
            // If we receive an unknown BIP155 network id (from the future?) then
            // ignore the address - unserialize as !IsValid().
            s.ignore(address_size);
        }

        // Mimic a default-constructed CNetAddr object which is !IsValid() and thus
        // will not be gossiped, but continue reading next addresses from the stream.
        m_net = NET_IPV6;
        m_addr.assign(ADDR_IPV6_SIZE, 0x0);
    }